

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

bool __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeUntilParen(ParseInput *this)

{
  bool bVar1;
  byte unaff_R15B;
  undefined1 local_70 [8];
  optional<wasm::WATParser::Token> t;
  
  do {
    peek((optional<wasm::WATParser::Token> *)local_70,this);
    if (t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index == '\x01') {
      if ((byte)t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_payload._48_1_ < 2) {
        unaff_R15B = 1;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        Lexer::operator++(&this->lexer);
      }
    }
    else {
      bVar1 = false;
      unaff_R15B = 0;
    }
    std::_Optional_payload_base<wasm::WATParser::Token>::_M_reset
              ((_Optional_payload_base<wasm::WATParser::Token> *)local_70);
  } while (bVar1);
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool takeUntilParen() {
    while (true) {
      auto t = peek();
      if (!t) {
        return false;
      }
      if (t->isLParen() || t->isRParen()) {
        return true;
      }
      ++lexer;
    }
  }